

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O0

int csp_rdp_close_internal(csp_conn_t *conn,uint8_t closed_by,_Bool send_rst)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  char *pcVar4;
  int in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  csp_packet_t *in_stack_00000040;
  csp_conn_t *in_stack_00000048;
  csp_bin_sem_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*(int *)(in_RDI + 200) == 0) {
    local_4 = 0;
  }
  else {
    *(byte *)(in_RDI + 0xcc) = *(byte *)(in_RDI + 0xcc) | in_SIL;
    if (*(int *)(in_RDI + 200) != 4) {
      *(undefined4 *)(in_RDI + 200) = 4;
      uVar1 = csp_get_ms();
      *(uint32_t *)(in_RDI + 0xc0) = uVar1;
      if ((in_DL & 1) != 0) {
        csp_rdp_send_cmp(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038,
                         in_stack_00000034);
      }
      if (1 < csp_dbg_rdp_print) {
        pcVar3 = "";
        if ((in_DL & 1) != 0) {
          pcVar3 = ", sent RST";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n\x1b[0m",in_RDI,
                       (ulong)in_SIL,pcVar3);
      }
      csp_bin_sem_post(in_stack_ffffffffffffffd8);
    }
    if (*(char *)(in_RDI + 0xcc) == '\a') {
      if (1 < csp_dbg_rdp_print) {
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) -> CLOSED\n\x1b[0m",in_RDI,(ulong)in_SIL
                      );
      }
      *(undefined4 *)(in_RDI + 200) = 0;
      *(undefined1 *)(in_RDI + 0xcc) = 0;
      local_4 = 0;
    }
    else {
      if (1 < csp_dbg_rdp_print) {
        pcVar3 = " userspace";
        if ((*(byte *)(in_RDI + 0xcc) & 1) != 0) {
          pcVar3 = "";
        }
        pcVar4 = " protocol";
        if ((*(byte *)(in_RDI + 0xcc) & 2) != 0) {
          pcVar4 = "";
        }
        pcVar2 = " timeout";
        if ((*(byte *)(in_RDI + 0xcc) & 4) != 0) {
          pcVar2 = "";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n\x1b[0m",
                       in_RDI,(ulong)in_SIL,(ulong)*(byte *)(in_RDI + 0xcc),pcVar3,pcVar4,pcVar2);
      }
      local_4 = -0xc;
    }
  }
  return local_4;
}

Assistant:

static int csp_rdp_close_internal(csp_conn_t * conn, uint8_t closed_by, bool send_rst) {

	if (conn->rdp.state == RDP_CLOSED) {
		return CSP_ERR_NONE;
	}

	conn->rdp.closed_by |= closed_by;

	/* If connection is open, send reset */
	if (conn->rdp.state != RDP_CLOSE_WAIT) {
		conn->rdp.state = RDP_CLOSE_WAIT;
		conn->timestamp = csp_get_ms();
		if (send_rst) {
			csp_rdp_send_cmp(conn, NULL, RDP_ACK | RDP_RST, conn->rdp.snd_nxt, conn->rdp.rcv_cur);
		}
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n", (void *)conn, closed_by, send_rst ? ", sent RST" : "");
		csp_bin_sem_post(&conn->rdp.tx_wait);  // wake up any pendng Tx
	}

	if (conn->rdp.closed_by != CSP_RDP_CLOSED_BY_ALL) {
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n",
						 (void *)conn, closed_by, conn->rdp.closed_by,
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_USERSPACE) ? "" : " userspace",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_PROTOCOL) ? "" : " protocol",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_TIMEOUT) ? "" : " timeout");
		return CSP_ERR_AGAIN;
	}

	csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) -> CLOSED\n", (void *)conn, closed_by);
	conn->rdp.state = RDP_CLOSED;
	conn->rdp.closed_by = 0;
	return CSP_ERR_NONE;
}